

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O2

int magma_ctr_acpkm_cipher_get_params(OSSL_PARAM *params)

{
  int iVar1;
  EVP_CIPHER *c;
  
  c = GOST_init_cipher(&magma_ctr_acpkm_cipher);
  iVar1 = cipher_get_params(c,params);
  return iVar1;
}

Assistant:

static int cipher_get_params(EVP_CIPHER *c, OSSL_PARAM params[])
{
    OSSL_PARAM *p;

    if (((p = OSSL_PARAM_locate(params, "blocksize")) != NULL
         && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_block_size(c)))
        || ((p = OSSL_PARAM_locate(params, "ivlen")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_iv_length(c)))
        || ((p = OSSL_PARAM_locate(params, "keylen")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_key_length(c)))
        || ((p = OSSL_PARAM_locate(params, "mode")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_flags(c))))
        return 0;
    return 1;
}